

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_polygon(nk_command_buffer *b,float *points,int point_count,float line_thickness,
                      nk_color col)

{
  void *pvVar1;
  nk_command_polygon *cmd;
  nk_size size;
  int i;
  float line_thickness_local;
  int point_count_local;
  float *points_local;
  nk_command_buffer *b_local;
  nk_color col_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x18f1,
                  "void nk_stroke_polygon(struct nk_command_buffer *, float *, int, float, struct nk_color)"
                 );
  }
  if (((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = col.a, b_local._7_1_ != '\0')) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_POLYGON,(long)point_count * 4 + 0x20),
     pvVar1 != (void *)0x0)) {
    *(nk_color *)((long)pvVar1 + 0x10) = col;
    *(short *)((long)pvVar1 + 0x14) = (short)(int)line_thickness;
    *(short *)((long)pvVar1 + 0x16) = (short)point_count;
    for (size._4_4_ = 0; size._4_4_ < point_count; size._4_4_ = size._4_4_ + 1) {
      *(short *)((long)pvVar1 + (long)size._4_4_ * 4 + 0x18) = (short)(int)points[size._4_4_ * 2];
      *(short *)((long)pvVar1 + (long)size._4_4_ * 4 + 0x1a) =
           (short)(int)points[(long)(size._4_4_ * 2) + 1];
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_polygon(struct nk_command_buffer *b,  float *points, int point_count,
    float line_thickness, struct nk_color col)
{
    int i;
    nk_size size = 0;
    struct nk_command_polygon *cmd;

    NK_ASSERT(b);
    if (!b || col.a == 0) return;
    size = sizeof(*cmd) + sizeof(short) * 2 * (nk_size)point_count;
    cmd = (struct nk_command_polygon*) nk_command_buffer_push(b, NK_COMMAND_POLYGON, size);
    if (!cmd) return;
    cmd->color = col;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->point_count = (unsigned short)point_count;
    for (i = 0; i < point_count; ++i) {
        cmd->points[i].x = (short)points[i*2];
        cmd->points[i].y = (short)points[i*2+1];
    }
}